

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O0

void Gia_ManSimRelCheckFuncs(Gia_Man_t *p,Vec_Wrd_t *vRel,int nOuts,Vec_Wrd_t *vFuncs)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  word *pwVar5;
  bool bVar6;
  int Value1;
  int Value0;
  int nWords;
  int nMints;
  int nErrors;
  int Values [32];
  int local_30;
  int m;
  int k;
  int i;
  Vec_Wrd_t *vFuncs_local;
  int nOuts_local;
  Vec_Wrd_t *vRel_local;
  Gia_Man_t *p_local;
  
  nWords = 0;
  iVar1 = 1 << ((byte)nOuts & 0x1f);
  iVar2 = Vec_WrdSize(vRel);
  iVar2 = iVar2 / iVar1;
  iVar3 = Vec_WrdSize(vFuncs);
  if (iVar3 != nOuts * 2 * iVar2) {
    __assert_fail("Vec_WrdSize(vFuncs) == 2 * nOuts * nWords",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0x2f4,"void Gia_ManSimRelCheckFuncs(Gia_Man_t *, Vec_Wrd_t *, int, Vec_Wrd_t *)")
    ;
  }
  if (nOuts < 0x21) {
    m = 0;
    do {
      if (iVar2 * 0x40 <= m) {
        if (nWords == 0) {
          printf("The function agrees with the relation.\n");
        }
        else {
          printf("Total number of similar errors = %d.\n",(ulong)(uint)nWords);
        }
        return;
      }
      for (local_30 = 0; local_30 < nOuts; local_30 = local_30 + 1) {
        pwVar5 = Vec_WrdEntryP(vFuncs,local_30 * 2 * iVar2);
        iVar3 = Abc_TtGetBit(pwVar5,m);
        pwVar5 = Vec_WrdEntryP(vFuncs,(local_30 * 2 + 1) * iVar2);
        iVar4 = Abc_TtGetBit(pwVar5,m);
        if ((iVar3 == 0) || (iVar4 != 0)) {
          if ((iVar3 == 0) && (iVar4 != 0)) {
            (&nMints)[local_30] = 2;
          }
          else {
            if ((iVar3 != 0) || (iVar4 != 0)) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                            ,0x302,
                            "void Gia_ManSimRelCheckFuncs(Gia_Man_t *, Vec_Wrd_t *, int, Vec_Wrd_t *)"
                           );
            }
            (&nMints)[local_30] = 3;
          }
        }
        else {
          (&nMints)[local_30] = 1;
        }
      }
      for (Values[0x1f] = 0; Values[0x1f] < iVar1; Values[0x1f] = Values[0x1f] + 1) {
        local_30 = 0;
        while ((local_30 < nOuts &&
               (((&nMints)[local_30] >> ((byte)(Values[0x1f] >> ((byte)local_30 & 0x1f)) & 1) & 1U)
                != 0))) {
          local_30 = local_30 + 1;
        }
        if (nOuts <= local_30) {
          pwVar5 = Vec_WrdArray(vRel);
          iVar3 = Abc_TtGetBit(pwVar5,m * iVar1 + Values[0x1f]);
          if ((iVar3 == 0) && (iVar3 = nWords + 1, bVar6 = nWords == 0, nWords = iVar3, bVar6)) {
            printf("For pattern %d, minterm %d produced by function is not in the relation.\n",
                   (ulong)(uint)m,(ulong)(uint)Values[0x1f]);
          }
        }
      }
      m = m + 1;
    } while( true );
  }
  __assert_fail("nOuts <= 32",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                ,0x2f5,"void Gia_ManSimRelCheckFuncs(Gia_Man_t *, Vec_Wrd_t *, int, Vec_Wrd_t *)");
}

Assistant:

void Gia_ManSimRelCheckFuncs( Gia_Man_t * p, Vec_Wrd_t * vRel, int nOuts, Vec_Wrd_t * vFuncs )
{
    int i, k, m, Values[32], nErrors = 0, nMints = 1 << nOuts, nWords = Vec_WrdSize(vRel) / nMints;
    assert( Vec_WrdSize(vFuncs) == 2 * nOuts * nWords );
    assert( nOuts <= 32 );
    for ( i = 0; i < 64 * nWords; i++ )
    {
        for ( k = 0; k < nOuts; k++ )
        {
            int Value0 = Abc_TtGetBit( Vec_WrdEntryP(vFuncs, (2*k+0)*nWords), i );
            int Value1 = Abc_TtGetBit( Vec_WrdEntryP(vFuncs, (2*k+1)*nWords), i );
            if ( Value0 && !Value1 )
                Values[k] = 1;
            else if ( !Value0 && Value1 )
                Values[k] = 2;
            else if ( !Value0 && !Value1 )
                Values[k] = 3;
            else assert( 0 );
        }
        for ( m = 0; m < nMints; m++ )
        {
            for ( k = 0; k < nOuts; k++ )
                if ( ((Values[k] >> ((m >> k) & 1)) & 1) == 0 )
                    break;
            if ( k < nOuts )
                continue;
            if ( Abc_TtGetBit( Vec_WrdArray(vRel), i*nMints+m ) )
                continue;
            if ( nErrors++ == 0 )
                printf( "For pattern %d, minterm %d produced by function is not in the relation.\n", i, m );
        }
    }
    if ( nErrors )    
        printf( "Total number of similar errors = %d.\n", nErrors );
    else
        printf( "The function agrees with the relation.\n" );
}